

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueFinder.hpp
# Opt level: O1

uint FMB::CliqueFinder::findMaxCliqueSize
               (DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                *Ngraph)

{
  int *piVar1;
  uint uVar2;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar3;
  Entry *pEVar4;
  Stack<unsigned_int> *pSVar5;
  bool bVar6;
  bool bVar7;
  Entry *pEVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar13;
  uint *puVar14;
  bool bVar15;
  uint local_ac;
  VirtualIterator<unsigned_int> local_a0;
  Stack<unsigned_int> local_98;
  DArray<Lib::Stack<unsigned_int>_> local_78;
  ulong local_60;
  ulong local_58;
  Stack<unsigned_int> *local_50;
  Iterator local_48;
  ulong uVar12;
  
  local_78._size = 0;
  local_78._capacity = 0;
  local_78._array = (Stack<unsigned_int> *)0x0;
  ::Lib::DArray<Lib::Stack<unsigned_int>_>::ensure(&local_78,(ulong)(Ngraph->_size + 1));
  local_48._base._last = Ngraph->_afterLast;
  local_48._base._timestamp = Ngraph->_timestamp;
  pEVar8 = Ngraph->_entries;
  while (local_48._base._next = pEVar8,
        bVar6 = ::Lib::
                DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::Iterator::hasNext(&local_48), bVar6) {
    uVar11 = (ulong)(uint)((local_48._base._next)->_val->_map)._size;
    pEVar8 = local_48._base._next + 1;
    if (uVar11 != 0) {
      uVar10 = (local_48._base._next)->_key;
      lVar13 = uVar11 << 5;
      local_48._base._next = local_48._base._next + 1;
      do {
        uVar11 = uVar11 - 1;
        pSVar5 = (Stack<unsigned_int> *)((long)&(local_78._array)->_capacity + lVar13);
        if (*(long *)((long)&(local_78._array)->_cursor + lVar13) ==
            *(long *)((long)&(local_78._array)->_end + lVar13)) {
          ::Lib::Stack<unsigned_int>::expand(pSVar5);
        }
        puVar14 = pSVar5->_cursor;
        *puVar14 = uVar10;
        pSVar5->_cursor = puVar14 + 1;
        lVar13 = lVar13 + -0x20;
        pEVar8 = local_48._base._next;
      } while ((int)uVar11 != 0);
    }
  }
  if (1 < (uint)local_78._size - 1) {
    uVar11 = (ulong)((uint)local_78._size - 1);
    uVar10 = (uint)local_78._size;
    do {
      puVar14 = local_78._array[uVar11]._cursor;
      uVar9 = (long)puVar14 - (long)local_78._array[uVar11]._stack >> 2;
      uVar12 = uVar11;
      if (uVar9 == uVar10) {
        bVar6 = checkClique(Ngraph,local_78._array + uVar11);
        if (bVar6) goto LAB_0029df09;
      }
      else {
        pSVar5 = local_78._array + uVar11;
        if (uVar10 < uVar9) {
          do {
            local_50 = pSVar5;
            local_60 = uVar11;
            bVar15 = puVar14 != local_50->_stack;
            bVar6 = uVar10 <= (uint)uVar9;
            if (!bVar6 || !bVar15) break;
            uVar2 = puVar14[-1];
            local_98._capacity = CONCAT44(local_98._capacity._4_4_,uVar2);
            local_58 = uVar9;
            pEVar8 = ::Lib::
                     DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                     ::findEntry(Ngraph,(uint *)&local_98);
            pDVar3 = pEVar8->_val;
            bVar7 = true;
            uVar9 = local_58;
            if (local_60 == (uint)(pDVar3->_map)._size) {
              local_98._cursor = (uint *)0x0;
              local_98._end = (uint *)0x0;
              local_98._capacity = 0;
              local_98._stack = (uint *)0x0;
              local_a0._core = (IteratorCore<unsigned_int> *)::operator_new(0x28);
              (local_a0._core)->_refCnt = 0;
              (local_a0._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b53500;
              pEVar4 = (pDVar3->_map)._afterLast;
              local_a0._core[1]._vptr_IteratorCore = (_func_int **)(pDVar3->_map)._entries;
              *(Entry **)&local_a0._core[1]._refCnt = pEVar4;
              *(uint *)&local_a0._core[2]._vptr_IteratorCore = (pDVar3->_map)._timestamp;
              (local_a0._core)->_refCnt = 1;
              ::Lib::Stack<unsigned_int>::loadFromIterator<Lib::VirtualIterator<unsigned_int>>
                        (&local_98,&local_a0);
              if (local_a0._core != (IteratorCore<unsigned_int> *)0x0) {
                piVar1 = &(local_a0._core)->_refCnt;
                *piVar1 = *piVar1 + -1;
                if (*piVar1 == 0) {
                  (*(local_a0._core)->_vptr_IteratorCore[1])();
                }
              }
              if (local_98._cursor == local_98._end) {
                ::Lib::Stack<unsigned_int>::expand(&local_98);
              }
              *local_98._cursor = uVar2;
              local_98._cursor = local_98._cursor + 1;
              bVar7 = checkClique(Ngraph,&local_98);
              if (bVar7) {
                local_ac = uVar10;
              }
              if (local_98._stack != (uint *)0x0) {
                uVar11 = local_98._capacity * 4 + 0xf & 0xfffffffffffffff0;
                if (uVar11 == 0) {
                  *(undefined8 *)local_98._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98._stack;
                }
                else if (uVar11 < 0x11) {
                  *(undefined8 *)local_98._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_98._stack;
                }
                else if (uVar11 < 0x19) {
                  *(undefined8 *)local_98._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_98._stack;
                }
                else if (uVar11 < 0x21) {
                  *(undefined8 *)local_98._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_98._stack;
                }
                else if (uVar11 < 0x31) {
                  *(undefined8 *)local_98._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_98._stack;
                }
                else if (uVar11 < 0x41) {
                  *(undefined8 *)local_98._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_98._stack;
                }
                else {
                  operator_delete(local_98._stack,0x10);
                }
              }
              bVar7 = !bVar7;
              uVar9 = (ulong)((int)local_58 - (uint)bVar7);
            }
            puVar14 = puVar14 + -1;
            uVar11 = local_60;
            pSVar5 = local_50;
          } while (bVar7);
          uVar12 = local_60;
          uVar10 = local_ac;
          if (bVar6 && bVar15) goto LAB_0029df09;
        }
      }
      uVar10 = (uint)uVar12;
      uVar11 = uVar12 - 1;
    } while (2 < uVar12);
  }
  uVar10 = 1;
LAB_0029df09:
  if ((local_78._array != (Stack<unsigned_int> *)0x0) &&
     (array_delete<Lib::Stack<unsigned_int>>(local_78._array,local_78._capacity),
     local_78._array != (Stack<unsigned_int> *)0x0)) {
    uVar11 = local_78._capacity << 5;
    if (uVar11 == 0) {
      (local_78._array)->_capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._array;
    }
    else if (uVar11 < 0x21) {
      (local_78._array)->_capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_78._array;
    }
    else if (uVar11 < 0x31) {
      (local_78._array)->_capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_78._array;
    }
    else if (uVar11 < 0x41) {
      (local_78._array)->_capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78._array;
    }
    else {
      operator_delete(local_78._array,0x10);
    }
  }
  return uVar10;
}

Assistant:

static unsigned findMaxCliqueSize(DHMap<unsigned,DHSet<unsigned>*>* Ngraph)
    {
      //std::cout << "findMaxCliqueSize with " << Ngraph->size() << std::endl;

      // at least stores the number of nodes with at least index neighbours
      DArray<Stack<unsigned>> atleast;
      atleast.ensure(Ngraph->size()+1); // the +1 is to protect against a self-loop sneaking in

      DHMap<unsigned,DHSet<unsigned>*>::Iterator miter(*Ngraph);
      while(miter.hasNext()){
        unsigned c;
        DHSet<unsigned>* nbs;
        miter.next(c,nbs);
        unsigned size = nbs->size();
        //std::cout << ">> " << c << ": " << size << std::endl;

        //DHSet<unsigned>::Iterator dit(*nbs);
        //while(dit.hasNext()){ std::cout << dit.next() << std::endl; }

        for(;size>0;size--){
          atleast[size].push(c);
        }
      }
      //std::cout << "Searching" << std::endl;

      for(unsigned i=atleast.size()-1;i>1;i--){
        // in this case we would expect atleast[i] to be the clique
        if(atleast[i].size() == i+1){
          //std::cout << "CASE 1" << std::endl;
          if(checkClique(Ngraph,atleast[i])){
            //std::cout << "FIND(A) max clique of " << (i+1) << std::endl;
            //for(unsigned j=0;j<atleast[i].size();j++){ std::cout << atleast[i][j] << " ";}; std::cout << std::endl;
            return i+1;
          }
        }
        // in this case atleast[i] may contain a clique but cannot be a clique itself
        // we need to look at subsets
        else if (atleast[i].size() > i+1){
          //std::cout << "CASE 2" << std::endl;
          unsigned left = atleast[i].size();
          Stack<unsigned>::Iterator niter(atleast[i]);
          while(niter.hasNext() && left >= i+1){
            unsigned c = niter.next();
            //std::cout << ">> " << c << std::endl;
            auto ns = Ngraph->get(c);
            if(ns->size()==i){
              Stack<unsigned> clique;
              clique.loadFromIterator(ns->iterator());
              clique.push(c);
              if(checkClique(Ngraph,clique)){
                //std::cout << "FIND(B) max clique of " << (i+1) << std::endl;
                return i+1;
              }
              left--;
            }
          }
          //std::cout << "In this case with " << std::left << " left" << std::endl;
        }
      }

      //for(unsigned i=1;i<atleast.size();i++){
      //  std::cout << i << ":"<< atleast[i].size() << std::endl; 
      //}
      return 1;
    }